

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O1

unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true> __thiscall
duckdb::WriteAheadLog::ReplayInternal
          (WriteAheadLog *this,AttachedDatabase *database,
          unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *handle)

{
  pointer pcVar1;
  AttachedDatabase *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer pFVar5;
  FileSystem *fs;
  type pCVar6;
  MetaTransaction *pMVar7;
  StorageManager *pSVar8;
  undefined7 extraout_var;
  WriteAheadLog *this_01;
  idx_t wal_size;
  Connection con;
  string wal_path;
  ReplayState state;
  BufferedFileReader reader;
  ReplayState checkpoint_state;
  WriteAheadLogDeserializer deserializer;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_480;
  AttachedDatabase *local_478;
  undefined8 local_470;
  Connection local_458;
  string local_438;
  DBConfig *local_418;
  ReplayState local_410;
  BufferedFileReader local_3b8;
  ReplayState local_378;
  WriteAheadLogDeserializer local_320;
  
  Connection::Connection(&local_458,database->db);
  pFVar5 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (handle);
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  pcVar1 = (pFVar5->path)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_438,pcVar1,pcVar1 + (pFVar5->path)._M_string_length);
  fs = FileSystem::Get(database);
  local_480._M_head_impl =
       (handle->super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)._M_t
       .super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  (handle->super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)._M_t.
  super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = (FileHandle *)0x0;
  BufferedFileReader::BufferedFileReader
            (&local_3b8,fs,
             (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
             &local_480);
  if (local_480._M_head_impl != (FileHandle *)0x0) {
    (*(local_480._M_head_impl)->_vptr_FileHandle[1])();
  }
  local_480._M_head_impl = (FileHandle *)0x0;
  bVar2 = BufferedFileReader::Finished(&local_3b8);
  if (bVar2) {
LAB_017f8ac9:
    this->_vptr_WriteAheadLog = (_func_int **)0x0;
  }
  else {
    Connection::BeginTransaction(&local_458);
    pCVar6 = shared_ptr<duckdb::ClientContext,_true>::operator*(&local_458.context);
    pMVar7 = MetaTransaction::Get(pCVar6);
    MetaTransaction::ModifyDatabase(pMVar7,database);
    local_418 = DBConfig::GetConfig(database->db);
    local_378.context = shared_ptr<duckdb::ClientContext,_true>::operator*(&local_458.context);
    local_378.db = database;
    local_378.catalog = AttachedDatabase::GetCatalog(database);
    local_378.current_table.ptr = (TableCatalogEntry *)0x0;
    local_378.checkpoint_id.block_pointer = 0xffffffffffffffff;
    local_378.checkpoint_id.offset = 0;
    local_378.checkpoint_id.unused_padding = 0;
    local_378.wal_version = 1;
    local_478 = database;
    do {
      WriteAheadLogDeserializer::Open(&local_320,&local_378,&local_3b8,true);
      bVar2 = WriteAheadLogDeserializer::ReplayEntry(&local_320);
      if (bVar2) {
        bVar2 = BufferedFileReader::Finished(&local_3b8);
        if (!bVar2) goto LAB_017f8a6a;
        bVar2 = false;
      }
      else {
LAB_017f8a6a:
        bVar2 = true;
      }
      Deserializer::~Deserializer(&local_320.deserializer.super_Deserializer);
      MemoryStream::~MemoryStream(&local_320.stream);
      if (local_320.data.super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>.
          _M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
          (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)0x0) {
        operator_delete__((void *)local_320.data.
                                  super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      }
      this_00 = local_478;
    } while (bVar2);
    if (local_378.checkpoint_id.block_pointer != 0xffffffffffffffff) {
      pSVar8 = AttachedDatabase::GetStorageManager(local_478);
      iVar4 = (*pSVar8->_vptr_StorageManager[4])
                        (pSVar8,local_378.checkpoint_id.block_pointer,
                         CONCAT44(local_378.checkpoint_id.unused_padding,
                                  local_378.checkpoint_id.offset));
      if ((char)iVar4 != '\0') goto LAB_017f8ac9;
    }
    local_410.context = shared_ptr<duckdb::ClientContext,_true>::operator*(&local_458.context);
    local_410.db = this_00;
    local_410.catalog = AttachedDatabase::GetCatalog(this_00);
    local_410.current_table.ptr = (TableCatalogEntry *)0x0;
    local_410.checkpoint_id.block_pointer = 0xffffffffffffffff;
    local_410.checkpoint_id.offset = 0;
    local_410.checkpoint_id.unused_padding = 0;
    local_410.wal_version = 1;
    BufferedFileReader::Reset(&local_3b8);
    wal_size = 0;
    local_470 = 0;
    do {
      WriteAheadLogDeserializer::Open(&local_320,&local_410,&local_3b8,false);
      bVar3 = WriteAheadLogDeserializer::ReplayEntry(&local_320);
      bVar2 = true;
      if (bVar3) {
        Connection::Commit(&local_458);
        wal_size = local_3b8.offset;
        bVar2 = BufferedFileReader::Finished(&local_3b8);
        if (bVar2) {
          local_470 = CONCAT71(extraout_var,1);
          bVar2 = false;
        }
        else {
          Connection::BeginTransaction(&local_458);
          pCVar6 = shared_ptr<duckdb::ClientContext,_true>::operator*(&local_458.context);
          pMVar7 = MetaTransaction::Get(pCVar6);
          bVar2 = true;
          MetaTransaction::ModifyDatabase(pMVar7,local_478);
        }
      }
      Deserializer::~Deserializer(&local_320.deserializer.super_Deserializer);
      MemoryStream::~MemoryStream(&local_320.stream);
      if (local_320.data.super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>.
          _M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
          (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)0x0) {
        operator_delete__((void *)local_320.data.
                                  super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      }
    } while (bVar2);
    this_01 = (WriteAheadLog *)operator_new(0x70);
    WriteAheadLog(this_01,local_478,&local_438,wal_size,
                  UNINITIALIZED_REQUIRES_TRUNCATE - ((byte)local_470 & 1));
    this->_vptr_WriteAheadLog = (_func_int **)this_01;
  }
  local_3b8.super_ReadStream._vptr_ReadStream = (_func_int **)&PTR_ReadData_02490ba8;
  if (local_3b8.handle.
      super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
      super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
      super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true,_true>)0x0)
  {
    (*(*(_func_int ***)
        local_3b8.handle.
        super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
        super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
        super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl)[1])();
  }
  local_3b8.handle.super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>.
  _M_t.super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)
       (__uniq_ptr_data<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true,_true>)0x0
  ;
  if (local_3b8.data.super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
      (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)0x0) {
    operator_delete__((void *)local_3b8.data.
                              super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p);
  }
  Connection::~Connection(&local_458);
  return (unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>)
         (unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>)this;
}

Assistant:

unique_ptr<WriteAheadLog> WriteAheadLog::ReplayInternal(AttachedDatabase &database, unique_ptr<FileHandle> handle) {
	Connection con(database.GetDatabase());
	auto wal_path = handle->GetPath();
	BufferedFileReader reader(FileSystem::Get(database), std::move(handle));
	if (reader.Finished()) {
		// WAL file exists but it is empty - we can delete the file
		return nullptr;
	}

	con.BeginTransaction();
	MetaTransaction::Get(*con.context).ModifyDatabase(database);

	auto &config = DBConfig::GetConfig(database.GetDatabase());
	// first deserialize the WAL to look for a checkpoint flag
	// if there is a checkpoint flag, we might have already flushed the contents of the WAL to disk
	ReplayState checkpoint_state(database, *con.context);
	try {
		while (true) {
			// read the current entry (deserialize only)
			auto deserializer = WriteAheadLogDeserializer::Open(checkpoint_state, reader, true);
			if (deserializer.ReplayEntry()) {
				// check if the file is exhausted
				if (reader.Finished()) {
					// we finished reading the file: break
					break;
				}
			}
		}
	} catch (std::exception &ex) { // LCOV_EXCL_START
		ErrorData error(ex);
		// ignore serialization exceptions - they signal a torn WAL
		if (error.Type() != ExceptionType::SERIALIZATION) {
			error.Throw("Failure while replaying WAL file \"" + wal_path + "\": ");
		}
	} // LCOV_EXCL_STOP
	if (checkpoint_state.checkpoint_id.IsValid()) {
		// there is a checkpoint flag: check if we need to deserialize the WAL
		auto &manager = database.GetStorageManager();
		if (manager.IsCheckpointClean(checkpoint_state.checkpoint_id)) {
			// the contents of the WAL have already been checkpointed
			// we can safely truncate the WAL and ignore its contents
			return nullptr;
		}
	}

	// we need to recover from the WAL: actually set up the replay state
	ReplayState state(database, *con.context);

	// reset the reader - we are going to read the WAL from the beginning again
	reader.Reset();

	// replay the WAL
	// note that everything is wrapped inside a try/catch block here
	// there can be errors in WAL replay because of a corrupt WAL file
	idx_t successful_offset = 0;
	bool all_succeeded = false;
	try {
		while (true) {
			// read the current entry
			auto deserializer = WriteAheadLogDeserializer::Open(state, reader);
			if (deserializer.ReplayEntry()) {
				con.Commit();
				successful_offset = reader.offset;
				// check if the file is exhausted
				if (reader.Finished()) {
					// we finished reading the file: break
					all_succeeded = true;
					break;
				}
				con.BeginTransaction();
				MetaTransaction::Get(*con.context).ModifyDatabase(database);
			}
		}
	} catch (std::exception &ex) { // LCOV_EXCL_START
		// exception thrown in WAL replay: rollback
		con.Query("ROLLBACK");
		ErrorData error(ex);
		// serialization failure means a truncated WAL
		// these failures are ignored unless abort_on_wal_failure is true
		// other failures always result in an error
		if (config.options.abort_on_wal_failure || error.Type() != ExceptionType::SERIALIZATION) {
			error.Throw("Failure while replaying WAL file \"" + wal_path + "\": ");
		}
	} catch (...) {
		// exception thrown in WAL replay: rollback
		con.Query("ROLLBACK");
		throw;
	} // LCOV_EXCL_STOP
	auto init_state = all_succeeded ? WALInitState::UNINITIALIZED : WALInitState::UNINITIALIZED_REQUIRES_TRUNCATE;
	return make_uniq<WriteAheadLog>(database, wal_path, successful_offset, init_state);
}